

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O3

QStringView QMakeInternal::IoUtils::fileName(QString *fileName)

{
  CutResult CVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  qsizetype local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (fileName->d).ptr;
  qVar2 = (fileName->d).size;
  QVar4.m_data = pcVar3;
  QVar4.m_size = qVar2;
  local_20 = QtPrivate::lastIndexOf(QVar4,-1,L'/',CaseSensitive);
  local_20 = local_20 + 1;
  local_28 = -1;
  CVar1 = QtPrivate::QContainerImplHelper::mid(qVar2,&local_20,&local_28);
  if (CVar1 == Null) {
    qVar2 = 0;
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = pcVar3 + local_20;
    qVar2 = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar5.m_data = pcVar3;
    QVar5.m_size = qVar2;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QStringView IoUtils::fileName(const QString &fileName)
{
    return QStringView(fileName).mid(fileName.lastIndexOf(QLatin1Char('/')) + 1);
}